

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__gl_hook_abstract
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  long lVar4;
  undefined8 uVar5;
  long *plVar6;
  void *pvVar7;
  StackMemoryManager *this_00;
  
  this_00 = &(this->
             super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
             ).super_ParserTemplateBase.mStackMemoryManager;
  plVar6 = (long *)GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x10);
  uVar5 = gl_hook_abstract__AttributeData::DEFAULT._8_8_;
  *plVar6 = gl_hook_abstract__AttributeData::DEFAULT._0_8_;
  plVar6[1] = uVar5;
  *attributeDataPtr = plVar6;
  ppxVar1 = attributes->attributes;
  if (ppxVar1 != (xmlChar **)0x0) {
    pxVar2 = *ppxVar1;
    while (pxVar2 != (xmlChar *)0x0) {
      pxVar3 = ppxVar1[1];
      if (*plVar6 == 0) {
        pvVar7 = GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x10);
      }
      else {
        pvVar7 = GeneratedSaxParser::StackMemoryManager::growObject(this_00,0x10);
      }
      *plVar6 = (long)pvVar7;
      lVar4 = plVar6[1];
      *(xmlChar **)((long)pvVar7 + lVar4 * 8) = pxVar2;
      *(xmlChar **)(*plVar6 + 8 + lVar4 * 8) = pxVar3;
      plVar6[1] = lVar4 + 2;
      pxVar2 = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    }
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__gl_hook_abstract( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__gl_hook_abstract( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

gl_hook_abstract__AttributeData* attributeData = newData<gl_hook_abstract__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
}


    return true;
}